

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

bool __thiscall Lexer::isDataType(Lexer *this)

{
  size_type sVar1;
  Lexer *local_10;
  Lexer *this_local;
  
  local_10 = this;
  getLexemValue_abi_cxx11_((Lexer *)&stack0xffffffffffffffd0);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
          ::count(&this->DATA_TYPES,(key_type *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return sVar1 != 0;
}

Assistant:

bool isDataType() {
        return DATA_TYPES.count(getLexemValue()) != 0;
    }